

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalSetEvent(CPalThread *pthr,HANDLE hEvent,BOOL fSetEvent)

{
  long *local_30;
  ISynchStateController *pssc;
  IPalObject *pobjEvent;
  PAL_ERROR palError;
  BOOL fSetEvent_local;
  HANDLE hEvent_local;
  CPalThread *pthr_local;
  
  pobjEvent._0_4_ = 0;
  pssc = (ISynchStateController *)0x0;
  local_30 = (long *)0x0;
  pobjEvent._4_4_ = fSetEvent;
  _palError = hEvent;
  hEvent_local = pthr;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalSetEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0x18c);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  pobjEvent._0_4_ =
       (**(code **)(*g_pObjectManager + 0x28))
                 (g_pObjectManager,hEvent_local,_palError,&aotEvent,0,&pssc);
  if ((PAL_ERROR)pobjEvent == 0) {
    pobjEvent._0_4_ = (*pssc->_vptr_ISynchStateController[5])(pssc,hEvent_local,&local_30);
    if ((PAL_ERROR)pobjEvent == 0) {
      pobjEvent._0_4_ = (**(code **)(*local_30 + 8))(local_30,pobjEvent._4_4_ != 0);
      if ((PAL_ERROR)pobjEvent != 0) {
        fprintf(_stderr,"] %s %s:%d","InternalSetEvent",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
                ,0x1b1);
        fprintf(_stderr,"Error %d setting event state\n",(ulong)(PAL_ERROR)pobjEvent);
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalSetEvent",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
              ,0x1a9);
      fprintf(_stderr,"Error %d obtaining synch state controller\n",(ulong)(PAL_ERROR)pobjEvent);
    }
  }
  else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x30))();
  }
  if (pssc != (ISynchStateController *)0x0) {
    (*pssc->_vptr_ISynchStateController[8])(pssc,hEvent_local);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (PAL_ERROR)pobjEvent;
}

Assistant:

PAL_ERROR
CorUnix::InternalSetEvent(
    CPalThread *pthr,
    HANDLE hEvent,
    BOOL fSetEvent
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjEvent = NULL;
    ISynchStateController *pssc = NULL;

    _ASSERTE(NULL != pthr);

    ENTRY("InternalSetEvent(pthr=%p, hEvent=%p, fSetEvent=%i\n",
        pthr,
        hEvent,
        fSetEvent
        );

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pthr,
        hEvent,
        &aotEvent,
        0, // Should be EVENT_MODIFY_STATE; currently ignored (no Win32 security)
        &pobjEvent
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to obtain object for handle %p (error %d)!\n", hEvent, palError);
        goto InternalSetEventExit;
    }

    palError = pobjEvent->GetSynchStateController(
        pthr,
        &pssc
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining synch state controller\n", palError);
        goto InternalSetEventExit;
    }

    palError = pssc->SetSignalCount(fSetEvent ? 1 : 0);

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d setting event state\n", palError);
        goto InternalSetEventExit;
    }

InternalSetEventExit:

    if (NULL != pssc)
    {
        pssc->ReleaseController();
    }

    if (NULL != pobjEvent)
    {
        pobjEvent->ReleaseReference(pthr);
    }

    LOGEXIT("InternalSetEvent returns %d\n", palError);

    return palError;
}